

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

bool progressMonitor(void *ptr,double n)

{
  __int_type _Var1;
  __int_type _Var2;
  int iVar3;
  __int_type _Var4;
  ostream *this;
  bool bVar5;
  double in_XMM0_Qa;
  undefined1 auVar6 [16];
  size_t i;
  size_t newdots;
  size_t maxdots;
  size_t olddots;
  undefined8 in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  ulong local_b8;
  ulong local_b0;
  __int_type local_a0;
  __int_type local_88;
  double local_80;
  ulong local_70;
  __int_type local_68;
  ulong local_60;
  ulong local_58;
  undefined4 local_4c;
  ulong local_48;
  __int_type *local_40;
  __int_type *local_38;
  bool local_29;
  ulong local_28;
  memory_order local_20;
  undefined4 local_1c;
  ulong local_18;
  __int_type *local_10;
  __int_type *local_8;
  
  local_80 = in_XMM0_Qa;
  local_88 = std::__atomic_base::operator_cast_to_unsigned_long
                       ((__atomic_base<unsigned_long> *)
                        CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  iVar3 = embree::progressWidth + -2;
  local_58 = (ulong)iVar3;
  auVar6._8_4_ = iVar3 >> 0x1f;
  auVar6._0_8_ = local_58;
  auVar6._12_4_ = 0x45300000;
  local_80 = local_80 *
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
  local_60 = (ulong)local_80;
  local_60 = local_60 | (long)(local_80 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
  local_b0 = local_60;
  if (local_58 < local_60) {
    local_b0 = local_58;
  }
  local_70 = local_b0;
  local_b8 = local_88;
  if (local_88 < local_b0) {
    local_b8 = local_b0;
  }
  local_38 = &embree::progressDots;
  local_48 = local_b8;
  local_4c = 5;
  local_68 = local_88;
  local_40 = &local_88;
  local_20 = std::__cmpexch_failure_order((memory_order)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  _Var2 = local_88;
  _Var1 = embree::progressDots;
  local_8 = &embree::progressDots;
  local_18 = local_b8;
  local_1c = 5;
  local_28 = local_b8;
  switch(0x17f87d) {
  default:
    if (local_20 - memory_order_consume < 2) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else if (local_20 == memory_order_seq_cst) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    break;
  case 2:
    if (local_20 - memory_order_consume < 2) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else if (local_20 == memory_order_seq_cst) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    break;
  case 3:
    if (local_20 - memory_order_consume < 2) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else if (local_20 == memory_order_seq_cst) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    break;
  case 4:
    if (local_20 - memory_order_consume < 2) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else if (local_20 == memory_order_seq_cst) {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
    else {
      LOCK();
      bVar5 = local_88 == embree::progressDots;
      _Var4 = embree::progressDots;
      if (bVar5) {
        embree::progressDots = local_b8;
        _Var4 = local_88;
      }
      UNLOCK();
      if (!bVar5) {
        local_88 = _Var4;
      }
    }
  }
  local_29 = _Var2 == _Var1;
  if (local_29) {
    local_10 = &local_88;
    for (local_a0 = local_88; local_a0 < local_b8; local_a0 = local_a0 + 1) {
      this = std::operator<<((ostream *)&std::cout,".");
      std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    }
  }
  return true;
}

Assistant:

bool progressMonitor(void* ptr, const double n)
  {
    size_t olddots = progressDots;
    size_t maxdots = progressWidth-2;
    size_t newdots = max(olddots,min(size_t(maxdots),size_t(n*double(maxdots))));
    if (progressDots.compare_exchange_strong(olddots,newdots))
      for (size_t i=olddots; i<newdots; i++) std::cout << "." << std::flush;
    return true;
  }